

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_hv.c
# Opt level: O0

void dtl_hv_set_cstr(dtl_hv_t *self,char *pKey,dtl_dv_t *dv,_Bool autoIncrementRef)

{
  dtl_dv_t *dv_00;
  dtl_dv_t *current;
  _Bool autoIncrementRef_local;
  dtl_dv_t *dv_local;
  char *pKey_local;
  dtl_hv_t *self_local;
  
  if (self != (dtl_hv_t *)0x0) {
    dv_00 = (dtl_dv_t *)adt_hash_get(self->pAny,pKey);
    if ((dv_00 != (dtl_dv_t *)0x0) && (dv_00 != dv)) {
      dtl_dv_dec_ref(dv_00);
    }
    adt_hash_set(self->pAny,pKey,dv);
    if (autoIncrementRef) {
      dtl_dv_inc_ref(dv);
    }
  }
  return;
}

Assistant:

void dtl_hv_set_cstr(dtl_hv_t *self, const char *pKey, dtl_dv_t *dv, bool autoIncrementRef)
{
	if(self)
	{
		dtl_dv_t *current = (dtl_dv_t*) adt_hash_get(self->pAny, pKey);
		if( (current != 0) && (current != dv) )
		{
			dtl_dv_dec_ref(current);
		}
		adt_hash_set(self->pAny,pKey,dv);
      if (autoIncrementRef)
      {
         dtl_dv_inc_ref(dv);
      }
	}
}